

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_base.c
# Opt level: O2

int lj_ffh_tostring(lua_State *L)

{
  uint uVar1;
  char *pcVar2;
  anon_union_4_2_de2f9c34_for_anon_struct_8_2_fd66bcdd_for_TValue_2_0 aVar3;
  TValue *pTVar4;
  cTValue *pcVar5;
  ulong uVar7;
  void *pvVar8;
  GCstr *pGVar6;
  
  pTVar4 = lj_lib_checkany(L,1);
  L->top = pTVar4 + 1;
  pcVar5 = lj_meta_lookup(L,pTVar4,MM_tostring);
  if ((pcVar5->field_2).it != 0xffffffff) {
    L->base[-1] = *pcVar5;
    return -1;
  }
  uVar1 = (pTVar4->field_2).it;
  if (uVar1 < 0xffff0000) {
    pGVar6 = lj_str_fromnum(L,&pTVar4->n);
    aVar3.i = (int32_t)pGVar6;
    goto LAB_0013cee0;
  }
  if (0xfffffffc < uVar1) {
    aVar3 = *(anon_union_4_2_de2f9c34_for_anon_struct_8_2_fd66bcdd_for_TValue_2_0 *)
             ((ulong)L->base[-1].u32.lo + 0x20 + (ulong)~uVar1 * 8);
    goto LAB_0013cee0;
  }
  if (uVar1 == 0xfffffff7) {
    if (*(byte *)((ulong)(pTVar4->u32).lo + 6) < 2) {
LAB_0013ceaa:
      uVar7 = (ulong)~uVar1;
      goto LAB_0013ceac;
    }
    lua_pushfstring(L,"function: builtin#%d");
  }
  else {
    if ((uVar1 & 0xffff8000) != 0xffff0000) goto LAB_0013ceaa;
    uVar7 = 3;
LAB_0013ceac:
    pcVar2 = lj_obj_itypename[uVar7];
    pvVar8 = lua_topointer(L,1);
    lua_pushfstring(L,"%s: %p",pcVar2,pvVar8);
  }
  aVar3 = L->top[-1].field_2.field_0;
LAB_0013cee0:
  pTVar4 = L->base;
  pTVar4[-1].u32.lo = (uint32_t)aVar3;
  *(undefined4 *)((long)pTVar4 + -4) = 0xfffffffb;
  return 2;
}

Assistant:

LJLIB_ASM(tostring)		LJLIB_REC(.)
{
  TValue *o = lj_lib_checkany(L, 1);
  cTValue *mo;
  L->top = o+1;  /* Only keep one argument. */
  if (!tvisnil(mo = lj_meta_lookup(L, o, MM_tostring))) {
    copyTV(L, L->base-1, mo);  /* Replace callable. */
    return FFH_TAILCALL;
  } else {
    GCstr *s;
    if (tvisnumber(o)) {
      s = lj_str_fromnumber(L, o);
    } else if (tvispri(o)) {
      s = strV(lj_lib_upvalue(L, -(int32_t)itype(o)));
    } else {
      if (tvisfunc(o) && isffunc(funcV(o)))
	lua_pushfstring(L, "function: builtin#%d", funcV(o)->c.ffid);
      else
	lua_pushfstring(L, "%s: %p", lj_typename(o), lua_topointer(L, 1));
      /* Note: lua_pushfstring calls the GC which may invalidate o. */
      s = strV(L->top-1);
    }
    setstrV(L, L->base-1, s);
    return FFH_RES(1);
  }
}